

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_field_test.cpp
# Opt level: O1

void flatbuffers::tests::NestedStructKeyInStructTest(void)

{
  uint off;
  uint start;
  ushort uVar1;
  Offset<flatbuffers::Vector<const_keyfield::sample::Fruit_*,_unsigned_int>_> off_00;
  uint off_01;
  Offset<keyfield::sample::FooTable> table;
  uint *puVar2;
  void *pvVar3;
  Fruit *pFVar4;
  int *piVar5;
  vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_> fruits;
  float test_float_array3 [3];
  float test_float_array2 [3];
  FlatBufferBuilder fbb;
  float test_float_array1 [3];
  Fruit local_130;
  vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_> local_118;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  Array<float,_(unsigned_short)3> local_e8;
  undefined4 uStack_dc;
  float local_d8 [4];
  float local_c8 [4];
  FlatBufferBuilderImpl<false> local_b8;
  float local_38 [4];
  
  local_b8.buf_.allocator_ = (Allocator *)0x0;
  local_b8.buf_.own_allocator_ = false;
  local_b8.buf_.initial_size_ = 0x400;
  local_b8.buf_.max_size_ = 0x7fffffff;
  local_b8.buf_.buffer_minalign_ = 8;
  local_b8.buf_.reserved_ = 0;
  local_b8.buf_.size_ = 0;
  local_b8.length_of_64_bit_region_ = 0;
  local_b8.nested = false;
  local_b8.finished = false;
  local_b8.buf_.buf_ = (uint8_t *)0x0;
  local_b8.buf_.cur_._0_6_ = 0;
  local_b8.buf_.cur_._6_2_ = 0;
  local_b8.buf_.scratch_._0_6_ = 0;
  local_b8._78_8_ = 0;
  local_b8.minalign_ = 1;
  local_b8.force_defaults_ = false;
  local_b8.dedup_vtables_ = true;
  local_b8.string_pool = (StringOffsetMap *)0x0;
  local_118.super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Fruit *)0x0;
  local_118.super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
  _M_impl.super__Vector_impl_data._M_start = (Fruit *)0x0;
  local_118.super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Fruit *)0x0;
  local_f8 = (undefined1  [8])local_38;
  local_38[2] = 0.0;
  local_38[0] = 1.5;
  local_38[1] = 2.5;
  local_c8[2] = 0.0;
  local_c8[0] = 1.5;
  local_c8[1] = 2.5;
  local_d8[0] = 1.5;
  local_d8[1] = 2.5;
  local_d8[2] = -1.0;
  uStack_dc._0_1_ = '\x02';
  uStack_dc._1_1_ = '\0';
  uStack_dc._2_2_ = 0;
  uStack_f0 = 3;
  Array<float,_(unsigned_short)3>::CopyFromSpan(&local_e8,(span<const_float,_3UL> *)local_f8);
  local_130.a_.tag_ = '\x02';
  local_130.a_.padding0__ = '\0';
  local_130.a_.padding1__ = 0;
  local_130.a_.color_.rgb_[0] = local_e8.data_._0_4_;
  local_130.a_.color_.rgb_[1] = local_e8.data_._4_4_;
  local_130.a_.color_.tag_ = (uint8_t)uStack_dc;
  local_130.a_.color_.padding0__ = uStack_dc._1_1_;
  local_130.a_.color_.padding1__ = uStack_dc._2_2_;
  local_130.b_ = '\x02';
  local_130.padding0__ = '\0';
  local_130.padding1__ = 0;
  if (local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>::
    _M_realloc_insert<keyfield::sample::Fruit>
              (&local_118,
               (iterator)
               local_118.
               super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_130);
  }
  else {
    *(ulong *)&((local_118.
                 super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->a_).color_.tag_ =
         CONCAT44(2,uStack_dc);
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).tag_ = (char)2;
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).padding0__ = (char)(2 >> 8);
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).padding1__ = (short)(2 >> 0x10);
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).color_.rgb_[0] = local_130.a_.color_.rgb_[0];
    *(ulong *)(((local_118.
                 super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->a_).color_.rgb_ + 1) =
         CONCAT44(local_e8.data_._8_4_,local_130.a_.color_.rgb_[1]);
    local_118.super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_118.
         super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  uStack_dc._0_1_ = '\x01';
  uStack_dc._1_1_ = '\0';
  uStack_dc._2_2_ = 0;
  uStack_f0 = 3;
  local_f8 = (undefined1  [8])local_c8;
  Array<float,_(unsigned_short)3>::CopyFromSpan(&local_e8,(span<const_float,_3UL> *)local_f8);
  local_130.a_.tag_ = '\x02';
  local_130.a_.padding0__ = '\0';
  local_130.a_.padding1__ = 0;
  local_130.a_.color_.rgb_[0] = local_e8.data_._0_4_;
  local_130.a_.color_.rgb_[1] = local_e8.data_._4_4_;
  local_130.a_.color_.tag_ = (uint8_t)uStack_dc;
  local_130.a_.color_.padding0__ = uStack_dc._1_1_;
  local_130.a_.color_.padding1__ = uStack_dc._2_2_;
  local_130.b_ = '\x01';
  local_130.padding0__ = '\0';
  local_130.padding1__ = 0;
  if (local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>::
    _M_realloc_insert<keyfield::sample::Fruit>
              (&local_118,
               (iterator)
               local_118.
               super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_130);
  }
  else {
    *(ulong *)&((local_118.
                 super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->a_).color_.tag_ =
         CONCAT44(1,uStack_dc);
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).tag_ = (char)2;
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).padding0__ = (char)(2 >> 8);
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).padding1__ = (short)(2 >> 0x10);
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).color_.rgb_[0] = local_130.a_.color_.rgb_[0];
    *(ulong *)(((local_118.
                 super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->a_).color_.rgb_ + 1) =
         CONCAT44(local_e8.data_._8_4_,local_130.a_.color_.rgb_[1]);
    local_118.super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_118.
         super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  uStack_dc._0_1_ = '\x03';
  uStack_dc._1_1_ = '\0';
  uStack_dc._2_2_ = 0;
  local_f8 = (undefined1  [8])local_d8;
  uStack_f0 = 3;
  Array<float,_(unsigned_short)3>::CopyFromSpan(&local_e8,(span<const_float,_3UL> *)local_f8);
  local_130.a_.tag_ = '\x02';
  local_130.a_.padding0__ = '\0';
  local_130.a_.padding1__ = 0;
  local_130.a_.color_.rgb_[0] = local_e8.data_._0_4_;
  local_130.a_.color_.rgb_[1] = local_e8.data_._4_4_;
  local_130.a_.color_.tag_ = (uint8_t)uStack_dc;
  local_130.a_.color_.padding0__ = uStack_dc._1_1_;
  local_130.a_.color_.padding1__ = uStack_dc._2_2_;
  local_130.b_ = '\x03';
  local_130.padding0__ = '\0';
  local_130.padding1__ = 0;
  if (local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>::
    _M_realloc_insert<keyfield::sample::Fruit>
              (&local_118,
               (iterator)
               local_118.
               super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_130);
  }
  else {
    *(ulong *)&((local_118.
                 super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->a_).color_.tag_ =
         CONCAT44(3,uStack_dc);
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).tag_ = (char)2;
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).padding0__ = (char)(2 >> 8);
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).padding1__ = (short)(2 >> 0x10);
    ((local_118.
      super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>._M_impl.
      super__Vector_impl_data._M_finish)->a_).color_.rgb_[0] = local_130.a_.color_.rgb_[0];
    *(ulong *)(((local_118.
                 super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->a_).color_.rgb_ + 1) =
         CONCAT44(local_e8.data_._8_4_,local_130.a_.color_.rgb_[1]);
    local_118.super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_118.
         super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  FlatBufferBuilderImpl<false>::CreateStringImpl(&local_b8,"TEST",4);
  off = local_b8.buf_.size_;
  pFVar4 = (Fruit *)&data<keyfield::sample::Fruit,std::allocator<keyfield::sample::Fruit>>(std::vector<keyfield::sample::Fruit,std::allocator<keyfield::sample::Fruit>>&)
                     ::t;
  if ((long)local_118.
            super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_118.
            super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    pFVar4 = local_118.
             super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  off_00 = FlatBufferBuilderImpl<false>::CreateVectorOfSortedStructs<keyfield::sample::Fruit>
                     (&local_b8,pFVar4,
                      ((long)local_118.
                             super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_118.
                             super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  FlatBufferBuilderImpl<false>::NotNested(&local_b8);
  start = local_b8.buf_.size_;
  local_b8.nested = true;
  off_01 = FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>(&local_b8,1);
  FlatBufferBuilderImpl<false>::TrackField(&local_b8,4,off_01);
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>
            (&local_b8,8,(Offset<flatbuffers::String>)off);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<keyfield::sample::Fruit_const*,unsigned_int>>(&local_b8,0x10,off_00)
  ;
  table.o = FlatBufferBuilderImpl<false>::EndTable(&local_b8,start);
  FlatBufferBuilderImpl<false>::Required<keyfield::sample::FooTable>(&local_b8,table,8);
  FlatBufferBuilderImpl<false>::Finish(&local_b8,table.o,(char *)0x0,false);
  puVar2 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer(&local_b8);
  if (puVar2 == (uint *)0x0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)((ulong)*puVar2 + (long)puVar2);
  }
  if (*(ushort *)((long)piVar5 - (long)*piVar5) < 0x11) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)((long)piVar5 + (0x10 - (long)*piVar5));
  }
  if (uVar1 == 0) {
    puVar2 = (uint *)0x0;
  }
  else {
    puVar2 = (uint *)((long)piVar5 + (ulong)*(uint *)((long)piVar5 + (ulong)uVar1) + (ulong)uVar1);
  }
  if (*puVar2 != 0) {
    TestEq<unsigned_char,int>
              ((uchar)puVar2[6],3,"\'sorted_fruit_vec->Get(0)->b()\' != \'3\'",
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/key_field_test.cpp"
               ,0x93,"");
    if (1 < *puVar2) {
      TestEq<unsigned_char,int>
                ((uchar)puVar2[0xc],1,"\'sorted_fruit_vec->Get(1)->b()\' != \'1\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/key_field_test.cpp"
                 ,0x94,"");
      if (2 < *puVar2) {
        TestEq<unsigned_char,int>
                  ((uchar)puVar2[0x12],2,"\'sorted_fruit_vec->Get(2)->b()\' != \'2\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/key_field_test.cpp"
                   ,0x95,"");
        uStack_f0._4_1_ = '\x01';
        uStack_f0._5_1_ = '\0';
        uStack_f0._6_2_ = 0;
        local_130.a_.color_.rgb_[1] = 4.2039e-45;
        local_130.a_.color_.rgb_[2] = 0.0;
        local_130.a_._0_8_ = local_c8;
        Array<float,_(unsigned_short)3>::CopyFromSpan
                  ((Array<float,_(unsigned_short)3> *)local_f8,(span<const_float,_3UL> *)&local_130)
        ;
        local_130.a_.tag_ = '\x02';
        local_130.a_.padding0__ = '\0';
        local_130.a_.padding1__ = 0;
        local_130.a_.color_.rgb_[0] = local_f8._0_4_;
        local_130.a_.color_.rgb_[1] = local_f8._4_4_;
        local_130.a_.color_.rgb_[2] = (float)uStack_f0;
        local_130.a_.color_.tag_ = uStack_f0._4_1_;
        local_130.a_.color_.padding0__ = uStack_f0._5_1_;
        local_130.a_.color_.padding1__ = uStack_f0._6_2_;
        pvVar3 = bsearch(&local_130,puVar2 + 1,(ulong)*puVar2,0x18,
                         Vector<const_keyfield::sample::Fruit_*,_unsigned_int>::
                         KeyCompare<keyfield::sample::Apple>);
        TestEq<unsigned_char,int>
                  (*(uchar *)((long)pvVar3 + 0x14),1,
                   "\'sorted_fruit_vec ->LookupByKey( Apple(2, Color(flatbuffers::make_span(test_float_array2), 1))) ->b()\' != \'1\'"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/key_field_test.cpp"
                   ,0x9a,"");
        uStack_f0._4_1_ = '\x01';
        uStack_f0._5_1_ = '\0';
        uStack_f0._6_2_ = 0;
        local_130.a_.color_.rgb_[1] = 4.2039e-45;
        local_130.a_.color_.rgb_[2] = 0.0;
        local_130.a_._0_8_ = local_c8;
        Array<float,_(unsigned_short)3>::CopyFromSpan
                  ((Array<float,_(unsigned_short)3> *)local_f8,(span<const_float,_3UL> *)&local_130)
        ;
        local_130.a_.tag_ = '\x01';
        local_130.a_.padding0__ = '\0';
        local_130.a_.padding1__ = 0;
        local_130.a_.color_.rgb_[0] = local_f8._0_4_;
        local_130.a_.color_.rgb_[1] = local_f8._4_4_;
        local_130.a_.color_.rgb_[2] = (float)uStack_f0;
        local_130.a_.color_.tag_ = uStack_f0._4_1_;
        local_130.a_.color_.padding0__ = uStack_f0._5_1_;
        local_130.a_.color_.padding1__ = uStack_f0._6_2_;
        pFVar4 = (Fruit *)bsearch(&local_130,puVar2 + 1,(ulong)*puVar2,0x18,
                                  Vector<const_keyfield::sample::Fruit_*,_unsigned_int>::
                                  KeyCompare<keyfield::sample::Apple>);
        TestEq<keyfield::sample::Fruit_const*,keyfield::sample::Fruit_const*>
                  (pFVar4,(Fruit *)0x0,
                   "\'sorted_fruit_vec->LookupByKey( Apple(1, Color(flatbuffers::make_span(test_float_array2), 1)))\' != \'static_cast<const Fruit *>(nullptr)\'"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/key_field_test.cpp"
                   ,0x9d,"");
        if (local_118.
            super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
            _M_impl.super__Vector_impl_data._M_start != (Fruit *)0x0) {
          operator_delete(local_118.
                          super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_118.
                                super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.
                                super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_b8);
        return;
      }
    }
  }
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,
                "return_type flatbuffers::Vector<const keyfield::sample::Fruit *>::Get(SizeT) const [T = const keyfield::sample::Fruit *, SizeT = unsigned int]"
               );
}

Assistant:

void NestedStructKeyInStructTest() {
  flatbuffers::FlatBufferBuilder fbb;
  std::vector<Fruit> fruits;
  float test_float_array1[3] = { 1.5, 2.5, 0 };
  float test_float_array2[3] = { 1.5, 2.5, 0 };
  float test_float_array3[3] = { 1.5, 2.5, -1 };

  fruits.push_back(
      Fruit(Apple(2, Color(flatbuffers::make_span(test_float_array1), 2)), 2));
  fruits.push_back(
      Fruit(Apple(2, Color(flatbuffers::make_span(test_float_array2), 1)), 1));
  fruits.push_back(
      Fruit(Apple(2, Color(flatbuffers::make_span(test_float_array3), 3)), 3));

  auto test_string = fbb.CreateString("TEST");
  auto fruits_vec = fbb.CreateVectorOfSortedStructs(&fruits);

  FooTableBuilder foo_builder(fbb);
  foo_builder.add_a(1);
  foo_builder.add_c(test_string);
  foo_builder.add_g(fruits_vec);

  auto orc = foo_builder.Finish();
  fbb.Finish(orc);
  uint8_t *buf = fbb.GetBufferPointer();
  auto foo_table = GetFooTable(buf);

  auto sorted_fruit_vec = foo_table->g();
  TEST_EQ(sorted_fruit_vec->Get(0)->b(), 3);
  TEST_EQ(sorted_fruit_vec->Get(1)->b(), 1);
  TEST_EQ(sorted_fruit_vec->Get(2)->b(), 2);
  TEST_EQ(sorted_fruit_vec
              ->LookupByKey(
                  Apple(2, Color(flatbuffers::make_span(test_float_array2), 1)))
              ->b(),
          1);
  TEST_EQ(sorted_fruit_vec->LookupByKey(
              Apple(1, Color(flatbuffers::make_span(test_float_array2), 1))),
          static_cast<const Fruit *>(nullptr));
}